

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_depspawn_sync.cpp
# Opt level: O0

void longf(float f)

{
  ostream *poVar1;
  float in_XMM0_Da;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff38;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff40;
  duration<double,_std::ratio<1L,_1L>_> local_48 [2];
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [4];
  float local_4;
  
  local_4 = in_XMM0_Da;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<((ostream *)&std::cerr,"longf begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with f=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," x=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x121777);
  x = x << 1;
  mywait((float)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  x = x << 1;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<((ostream *)&std::cerr,"longf end: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff40,&in_stack_ffffffffffffff38->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with f=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," x=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1218c6);
  return;
}

Assistant:

void longf(float f) {
  LOG("longf begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
  
  x = x * 2;
  
  mywait(f);
  
  x = x * 2;
  
  LOG("longf end: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with f=" << f << " x=" << x);
}